

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkLayerValidator.cpp
# Opt level: O0

Result * __thiscall
CoreML::NeuralNetworkSpecValidator::validateCustomLayer
          (Result *__return_storage_ptr__,NeuralNetworkSpecValidator *this,NeuralNetworkLayer *layer
          )

{
  bool bVar1;
  CustomLayerParams *pCVar2;
  long lVar3;
  string *psVar4;
  RepeatedPtrField<CoreML::Specification::WeightParams> *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  undefined1 local_c0 [8];
  string err_1;
  WeightParams *param;
  const_iterator __end1;
  const_iterator __begin1;
  RepeatedPtrField<CoreML::Specification::WeightParams> *__range1;
  undefined1 local_60 [8];
  string err;
  NeuralNetworkLayer *layer_local;
  NeuralNetworkSpecValidator *this_local;
  Result *_result;
  
  validateInputCount(__return_storage_ptr__,layer,1,-1);
  bVar1 = Result::good(__return_storage_ptr__);
  if (bVar1) {
    Result::~Result(__return_storage_ptr__);
    err.field_2._M_local_buf[0xf] = '\0';
    validateOutputCount(__return_storage_ptr__,layer,1,-1);
    bVar1 = Result::good(__return_storage_ptr__);
    if (!bVar1) {
      err.field_2._M_local_buf[0xf] = '\x01';
    }
    if ((err.field_2._M_local_buf[0xf] & 1U) == 0) {
      Result::~Result(__return_storage_ptr__);
    }
    if (bVar1) {
      pCVar2 = Specification::NeuralNetworkLayer::custom(layer);
      Specification::CustomLayerParams::classname_abi_cxx11_(pCVar2);
      lVar3 = std::__cxx11::string::size();
      if (lVar3 == 0) {
        psVar4 = Specification::NeuralNetworkLayer::name_abi_cxx11_(layer);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &__range1,"Custom layer ",psVar4);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_60
                       ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &__range1,
                       " has an empty \'className\' field. This field is required in order for Core ML to link to the implementation for this custom class."
                      );
        std::__cxx11::string::~string((string *)&__range1);
        Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_60);
        std::__cxx11::string::~string((string *)local_60);
      }
      else {
        pCVar2 = Specification::NeuralNetworkLayer::custom(layer);
        this_00 = Specification::CustomLayerParams::weights(pCVar2);
        __end1 = google::protobuf::RepeatedPtrField<CoreML::Specification::WeightParams>::begin
                           (this_00);
        param = (WeightParams *)
                google::protobuf::RepeatedPtrField<CoreML::Specification::WeightParams>::end
                          (this_00);
        while (bVar1 = google::protobuf::internal::
                       RepeatedPtrIterator<const_CoreML::Specification::WeightParams>::operator!=
                                 (&__end1,(iterator *)&param), bVar1) {
          err_1.field_2._8_8_ =
               google::protobuf::internal::
               RepeatedPtrIterator<const_CoreML::Specification::WeightParams>::operator*(&__end1);
          bVar1 = checkSingleWeightType((WeightParams *)err_1.field_2._8_8_);
          if (!bVar1) {
            psVar4 = Specification::NeuralNetworkLayer::name_abi_cxx11_(layer);
            std::operator+(&local_e0,"Custom layer ",psVar4);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_c0,&local_e0,
                           " has a weights parameter with multiple types filled in.  The WeightParams message should be treated as a oneof."
                          );
            std::__cxx11::string::~string((string *)&local_e0);
            Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_c0);
            std::__cxx11::string::~string((string *)local_c0);
            return __return_storage_ptr__;
          }
          google::protobuf::internal::RepeatedPtrIterator<const_CoreML::Specification::WeightParams>
          ::operator++(&__end1);
        }
        Result::Result(__return_storage_ptr__);
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Result NeuralNetworkSpecValidator::validateCustomLayer(const Specification::NeuralNetworkLayer& layer) {
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateInputCount(layer, 1, -1));
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateOutputCount(layer, 1, -1));

    if (layer.custom().classname().size() == 0) {
        std::string err = "Custom layer " + layer.name() + " has an empty 'className' field. This field is required in order for Core ML to link to the implementation for this custom class.";
        return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
    }

    for (const auto& param: layer.custom().weights()) {
        if (!checkSingleWeightType(param)) {
            std::string err = "Custom layer " + layer.name() + " has a weights parameter with multiple types filled in.  The WeightParams message should be treated as a oneof.";
            return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
        }
    }

    return Result();
}